

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ColorMaskCase::iterate(ColorMaskCase *this)

{
  TestLog *pTVar1;
  byte bVar2;
  undefined1 uVar3;
  int iVar4;
  GLenum err;
  undefined4 extraout_var;
  byte bVar5;
  int ndx;
  GLuint GVar6;
  allocator<char> local_e6;
  allocator<char> local_e5;
  deInt32 maxDrawBuffers;
  ScopedLogSection section;
  string local_d8;
  CallLogWrapper gl;
  string local_a0;
  ResultCollector result;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8," // ERROR: ",(allocator<char> *)&local_a0);
  tcu::ResultCollector::ResultCollector(&result,pTVar1,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  maxDrawBuffers = 0;
  gl.m_enableLog = true;
  glu::CallLogWrapper::glGetIntegerv(&gl,0x8824,&maxDrawBuffers);
  err = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(err,"glGetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x3cc);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Initial",&local_e5);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"Initial value",&local_e6);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_d8,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_d8);
  for (iVar4 = 0; iVar4 < maxDrawBuffers; iVar4 = iVar4 + 1) {
    tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)&local_d8,true);
    deqp::gls::StateQueryUtil::verifyStateIndexedBooleanVec4
              (&result,&gl,0xc23,iVar4,(BVec4 *)&local_d8,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"AfterSettingCommon",&local_e5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"After setting common",&local_e6);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_d8,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_d8);
  glu::CallLogWrapper::glColorMask(&gl,'\0','\x01','\x01','\0');
  for (iVar4 = 0; iVar4 < maxDrawBuffers; iVar4 = iVar4 + 1) {
    local_d8._M_dataplus._M_p._0_4_ = 0x10100;
    deqp::gls::StateQueryUtil::verifyStateIndexedBooleanVec4
              (&result,&gl,0xc23,iVar4,(BVec4 *)&local_d8,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"AfterSettingIndexed",&local_e5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"After setting indexed",&local_e6);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_d8,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_d8);
  for (GVar6 = 0; (int)GVar6 < maxDrawBuffers; GVar6 = GVar6 + 1) {
    bVar2 = ~(byte)GVar6 & 1;
    bVar5 = (byte)GVar6 & 1;
    glu::CallLogWrapper::glColorMaski(&gl,GVar6,bVar2,bVar5,bVar2,bVar5);
  }
  for (iVar4 = 0; iVar4 < maxDrawBuffers; iVar4 = iVar4 + 1) {
    uVar3 = (undefined1)iVar4;
    local_d8._M_dataplus._M_p._0_4_ =
         ((CONCAT13(uVar3,CONCAT12(uVar3,CONCAT11(uVar3,uVar3))) & 0xffffff01 ^ 1) & 0xff0101ff ^
         0x10000) & 0x1ffffff;
    deqp::gls::StateQueryUtil::verifyStateIndexedBooleanVec4
              (&result,&gl,0xc23,iVar4,(BVec4 *)&local_d8,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"AfterResettingIndexedWithCommon",&local_e5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"After resetting indexed with common",&local_e6);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_d8,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_d8);
  for (GVar6 = 0; (int)GVar6 < maxDrawBuffers; GVar6 = GVar6 + 1) {
    bVar2 = ~(byte)GVar6 & 1;
    bVar5 = (byte)GVar6 & 1;
    glu::CallLogWrapper::glColorMaski(&gl,GVar6,bVar2,bVar5,bVar2,bVar5);
  }
  glu::CallLogWrapper::glColorMask(&gl,'\0','\x01','\x01','\0');
  for (iVar4 = 0; iVar4 < maxDrawBuffers; iVar4 = iVar4 + 1) {
    local_d8._M_dataplus._M_p._0_4_ = 0x10100;
    deqp::gls::StateQueryUtil::verifyStateIndexedBooleanVec4
              (&result,&gl,0xc23,iVar4,(BVec4 *)&local_d8,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

ColorMaskCase::IterateResult ColorMaskCase::iterate (void)
{
	glu::CallLogWrapper		gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result			(m_testCtx.getLog(), " // ERROR: ");
	deInt32					maxDrawBuffers = 0;

	gl.enableLogging(true);

	gl.glGetIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "glGetIntegerv");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial value");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedBooleanVec4(result, gl, GL_COLOR_WRITEMASK, ndx, tcu::BVec4(true), m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingCommon", "After setting common");

		gl.glColorMask(GL_FALSE, GL_TRUE, GL_TRUE, GL_FALSE);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedBooleanVec4(result, gl, GL_COLOR_WRITEMASK, ndx, tcu::BVec4(false, true, true, false), m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingIndexed", "After setting indexed");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glColorMaski(ndx, (ndx % 2 == 0 ? GL_TRUE : GL_FALSE), (ndx % 2 == 1 ? GL_TRUE : GL_FALSE), (ndx % 2 == 0 ? GL_TRUE : GL_FALSE), (ndx % 2 == 1 ? GL_TRUE : GL_FALSE));

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedBooleanVec4(result, gl, GL_COLOR_WRITEMASK, ndx, (ndx % 2 == 0 ? tcu::BVec4(true, false, true, false) : tcu::BVec4(false, true, false, true)), m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterResettingIndexedWithCommon", "After resetting indexed with common");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glColorMaski(ndx, (ndx % 2 == 0 ? GL_TRUE : GL_FALSE), (ndx % 2 == 1 ? GL_TRUE : GL_FALSE), (ndx % 2 == 0 ? GL_TRUE : GL_FALSE), (ndx % 2 == 1 ? GL_TRUE : GL_FALSE));

		gl.glColorMask(GL_FALSE, GL_TRUE, GL_TRUE, GL_FALSE);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedBooleanVec4(result, gl, GL_COLOR_WRITEMASK, ndx, tcu::BVec4(false, true, true, false), m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}